

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

void __thiscall
google::protobuf::Reflection::UnsafeArenaSetAllocatedMessage
          (Reflection *this,Message *message,Message *sub_message,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  int number;
  Type TVar3;
  Reflection *pRVar4;
  Descriptor *actual;
  Descriptor *pDVar5;
  ExtensionSet *this_00;
  OneofDescriptor *pOVar6;
  Message **ppMVar7;
  Arena *pAVar8;
  Message **sub_message_holder;
  FieldDescriptor *field_local;
  Message *sub_message_local;
  Message *message_local;
  Reflection *this_local;
  
  pRVar4 = Message::GetReflection(message);
  if (this != pRVar4) {
    pDVar5 = this->descriptor_;
    actual = Message::GetDescriptor(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar5,actual,field,"SetAllocatedMessage");
  }
  pDVar5 = FieldDescriptor::containing_type(field);
  if (pDVar5 != this->descriptor_) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"SetAllocatedMessage","Field does not match message type.");
  }
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    anon_unknown_6::ReportReflectionUsageError
              (this->descriptor_,field,"SetAllocatedMessage",
               "Field is repeated; the method requires a singular field.");
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 != CPPTYPE_MESSAGE) {
    anon_unknown_6::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetAllocatedMessage",CPPTYPE_MESSAGE);
  }
  bVar1 = FieldDescriptor::is_extension(field);
  if (bVar1) {
    this_00 = MutableExtensionSet(this,message);
    number = FieldDescriptor::number(field);
    TVar3 = FieldDescriptor::type(field);
    internal::ExtensionSet::UnsafeArenaSetAllocatedMessage
              (this_00,number,(FieldType)TVar3,field,&sub_message->super_MessageLite);
  }
  else {
    bVar1 = internal::ReflectionSchema::InRealOneof(&this->schema_,field);
    if (bVar1) {
      if (sub_message == (Message *)0x0) {
        pOVar6 = FieldDescriptor::containing_oneof(field);
        ClearOneof(this,message,pOVar6);
      }
      else {
        pOVar6 = FieldDescriptor::containing_oneof(field);
        ClearOneof(this,message,pOVar6);
        ppMVar7 = MutableRaw<google::protobuf::Message*>(this,message,field);
        *ppMVar7 = sub_message;
        SetOneofCase(this,message,field);
      }
    }
    else {
      if (sub_message == (Message *)0x0) {
        ClearHasBit(this,message,field);
      }
      else {
        SetHasBit(this,message,field);
      }
      ppMVar7 = MutableRaw<google::protobuf::Message*>(this,message,field);
      pAVar8 = protobuf::MessageLite::GetArena(&message->super_MessageLite);
      if ((pAVar8 == (Arena *)0x0) && (*ppMVar7 != (Message *)0x0)) {
        (*((*ppMVar7)->super_MessageLite)._vptr_MessageLite[1])();
      }
      *ppMVar7 = sub_message;
    }
  }
  return;
}

Assistant:

void Reflection::UnsafeArenaSetAllocatedMessage(
    Message* message, Message* sub_message,
    const FieldDescriptor* field) const {
  USAGE_MUTABLE_CHECK_ALL(SetAllocatedMessage, SINGULAR, MESSAGE);


  if (field->is_extension()) {
    MutableExtensionSet(message)->UnsafeArenaSetAllocatedMessage(
        field->number(), field->type(), field, sub_message);
  } else {
    if (schema_.InRealOneof(field)) {
      if (sub_message == nullptr) {
        ClearOneof(message, field->containing_oneof());
        return;
      }
        ClearOneof(message, field->containing_oneof());
        *MutableRaw<Message*>(message, field) = sub_message;
      SetOneofCase(message, field);
      return;
    }

    if (sub_message == nullptr) {
      ClearHasBit(message, field);
    } else {
      SetHasBit(message, field);
    }
    Message** sub_message_holder = MutableRaw<Message*>(message, field);
    if (message->GetArena() == nullptr) {
      delete *sub_message_holder;
    }
    *sub_message_holder = sub_message;
  }
}